

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O2

void __thiscall
trt_pose::parse::munkresStep5
          (parse *this,float *cost_graph,int M,CoverTable *cover_table,int nrows,int ncols)

{
  bool bVar1;
  bool bVar2;
  int j_1;
  long lVar3;
  undefined4 in_register_00000014;
  CoverTable *this_00;
  ulong uVar4;
  int j;
  ulong uVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  parse *ppVar8;
  float in_XMM0_Da;
  float fVar9;
  
  this_00 = (CoverTable *)CONCAT44(in_register_00000014,M);
  uVar7 = 0;
  uVar4 = (ulong)(uint)nrows;
  if (nrows < 1) {
    uVar4 = uVar7;
  }
  uVar5 = (ulong)cover_table & 0xffffffff;
  if ((int)cover_table < 1) {
    uVar5 = uVar7;
  }
  lVar3 = (long)(int)cost_graph * 4;
  bVar2 = false;
  ppVar8 = this;
  for (; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      bVar1 = utils::CoverTable::isCovered(this_00,(int)uVar7,(int)uVar6);
      fVar9 = in_XMM0_Da;
      if (!bVar1) {
        if (bVar2) {
          bVar2 = true;
          fVar9 = *(float *)(ppVar8 + uVar6 * 4);
          if (in_XMM0_Da <= *(float *)(ppVar8 + uVar6 * 4)) {
            fVar9 = in_XMM0_Da;
          }
        }
        else {
          bVar2 = true;
          fVar9 = *(float *)(ppVar8 + uVar6 * 4);
        }
      }
      in_XMM0_Da = fVar9;
    }
    ppVar8 = ppVar8 + lVar3;
  }
  ppVar8 = this;
  for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    bVar2 = utils::CoverTable::isRowCovered(this_00,(int)uVar7);
    if (bVar2) {
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        *(float *)(ppVar8 + uVar6 * 4) = *(float *)(ppVar8 + uVar6 * 4) + in_XMM0_Da;
      }
    }
    ppVar8 = ppVar8 + lVar3;
  }
  for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
    bVar2 = utils::CoverTable::isColCovered(this_00,(int)uVar7);
    ppVar8 = this;
    uVar6 = uVar5;
    if (!bVar2) {
      while (uVar6 != 0) {
        *(float *)ppVar8 = *(float *)ppVar8 - in_XMM0_Da;
        ppVar8 = ppVar8 + lVar3;
        uVar6 = uVar6 - 1;
      }
    }
    this = this + 4;
  }
  return;
}

Assistant:

void munkresStep5(float *cost_graph, const int M, const CoverTable &cover_table,
                  const int nrows, const int ncols) {
  bool valid = false;
  float min;
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (!cover_table.isCovered(i, j)) {
        if (!valid) {
          min = cost_graph[i * M + j];
          valid = true;
        } else if (cost_graph[i * M + j] < min) {
          min = cost_graph[i * M + j];
        }
      }
    }
  }

  for (int i = 0; i < nrows; i++) {
    if (cover_table.isRowCovered(i)) {
      for (int j = 0; j < ncols; j++) {
        cost_graph[i * M + j] += min;
      }
      //       cost_graph.addToRow(i, min);
    }
  }
  for (int j = 0; j < ncols; j++) {
    if (!cover_table.isColCovered(j)) {
      for (int i = 0; i < nrows; i++) {
        cost_graph[i * M + j] -= min;
      }
      //       cost_graph.addToCol(j, -min);
    }
  }
}